

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingEnums.cpp
# Opt level: O2

cx_string<19UL> * mserialize::CustomTag<Nest::Nested,_void>::tag_string(void)

{
  cx_string<6UL> cVar1;
  cx_string<19UL> *in_RDI;
  cx_string<1UL> *in_stack_ffffffffffffffb0;
  undefined1 local_48 [4];
  cx_string<1UL> local_44;
  undefined2 local_42;
  undefined4 local_40;
  undefined2 local_3c;
  char local_3a;
  char local_38 [10];
  
  local_42 = 0x2f;
  local_44._data[0] = 'I';
  local_44._data[1] = '\0';
  local_38 = (char  [10])make_cx_string<10UL>((char (*) [10])"`NestedT\'");
  local_48[2] = '0';
  local_48[3] = '\0';
  cVar1 = make_cx_string<7UL>((char (*) [7])"`Bird\'");
  local_40 = cVar1._data._0_4_;
  local_3a = cVar1._data[6];
  local_3c = cVar1._data._4_2_;
  local_48[0] = '\\';
  local_48[1] = '\0';
  cx_strcat<1ul,1ul,9ul,1ul,6ul,1ul>
            (in_RDI,(mserialize *)&local_42,&local_44,(cx_string<1UL> *)local_38,
             (cx_string<9UL> *)(local_48 + 2),(cx_string<1UL> *)&local_40,(cx_string<6UL> *)local_48
             ,in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

int main()
{
  //[basic
  BINLOG_INFO("Enum: {}", Alpha);
  // Outputs: Enum: 123
  //]

  //[adapted

  BINLOG_INFO("Adapted enum: {}", Delta);
  // Outputs: Adapted enum: Delta
  //]

  //[scoped

  BINLOG_INFO("Scoped enum: {}", ScopedEnum::Epsilon);
  // Outputs: Scoped enum: Epsilon

  //]

  BINLOG_INFO("Partially adapted enum: {} {} {}", Rho, Sigma, Tau);
  // Outputs: Partially adapted enum: Rho Sigma 0x28

  BINLOG_INFO("Shadowed enum type: {}", Nest::Nested::Bird);
  // Outputs: Shadowed enum type: Bird

  binlog::consume(std::cout);
  return 0;
}